

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  stbi__uint32 *y_00;
  int *comp_00;
  anon_struct_96_18_0d0905d3 *paVar1;
  uchar uVar2;
  undefined1 uVar3;
  short sVar4;
  ushort uVar5;
  long lVar6;
  short sVar7;
  bool bVar8;
  stbi_uc sVar9;
  stbi_uc sVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  int iVar16;
  stbi__uint32 sVar17;
  uint uVar18;
  stbi__uint32 sVar19;
  stbi__uint32 sVar20;
  int iVar21;
  stbi_uc asVar22 [4];
  uint uVar23;
  int iVar24;
  uint uVar25;
  char *pcVar26;
  void *pvVar27;
  stbi__context *psVar28;
  stbi__jpeg *psVar29;
  stbi__uint16 *psVar30;
  stbi_uc *psVar31;
  long lVar32;
  uchar *puVar33;
  code *pcVar34;
  undefined8 uVar35;
  long lVar36;
  short sVar37;
  int iVar38;
  int iVar39;
  ulong uVar40;
  int id;
  ulong uVar41;
  stbi__context *psVar42;
  int iVar43;
  undefined1 *puVar44;
  undefined4 in_register_00000084;
  anon_struct_96_18_0d0905d3 *paVar45;
  byte *pbVar46;
  stbi__result_info *ri_00;
  int iVar47;
  uint uVar48;
  uint uVar49;
  int iVar50;
  ulong uVar51;
  uint uVar52;
  ulong uVar53;
  stbi_uc *psVar54;
  short *psVar55;
  stbi_uc *psVar56;
  long in_FS_OFFSET;
  bool bVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar60 [16];
  stbi__uint16 *local_8988;
  stbi__jpeg *local_8980;
  stbi__jpeg *local_8968;
  uint local_8958;
  uint local_890c;
  uint local_88fc;
  stbi_uc value [4];
  int iStack_88f4;
  int iStack_88f0;
  uint uStack_88ec;
  uint local_88e8;
  uint uStack_88e4;
  uint uStack_88e0;
  uint uStack_88dc;
  int local_88d8;
  uint local_88c8;
  uint local_88bc;
  stbi_uc pal [256] [4];
  
  psVar56 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  iVar16 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar16 != 0) {
    if (4 < (uint)req_comp) {
      pcVar26 = "bad req_comp";
      goto LAB_001172c8;
    }
    pal._0_8_ = s;
    iVar16 = stbi__parse_png_file((stbi__png *)pal,0,req_comp);
    uVar35 = pal._0_8_;
    if (iVar16 == 0) {
      psVar28 = (stbi__context *)0x0;
    }
    else {
      if ((int)pal[8] < 9) {
        iVar16 = 8;
      }
      else {
        if (pal[8] != (stbi_uc  [4])0x10) {
          pcVar26 = "bad bits_per_channel";
          goto LAB_001172c8;
        }
        iVar16 = 0x10;
      }
      ri->bits_per_channel = iVar16;
      if ((req_comp != 0) && (iVar16 = *(int *)(pal._0_8_ + 0xc), iVar16 != req_comp)) {
        if ((int)pal[8] < 9) {
          pal._24_8_ = stbi__convert_format
                                 ((uchar *)pal._24_8_,iVar16,req_comp,*(uint *)pal._0_8_,
                                  *(uint *)(pal._0_8_ + 4));
        }
        else {
          pal._24_8_ = stbi__convert_format16
                                 ((stbi__uint16 *)pal._24_8_,iVar16,req_comp,*(uint *)pal._0_8_,
                                  *(uint *)(pal._0_8_ + 4));
        }
        *(int *)(uVar35 + 0xc) = req_comp;
        if ((stbi__context *)pal._24_8_ == (stbi__context *)0x0) {
          return (void *)0x0;
        }
      }
      *x = *(int *)uVar35;
      *y = *(int *)(uVar35 + 4);
      if (comp != (int *)0x0) {
        *comp = *(int *)(uVar35 + 8);
      }
      psVar28 = (stbi__context *)pal._24_8_;
      pal._24_8_ = (void *)0x0;
    }
    free((void *)pal._24_8_);
    free((void *)pal._16_8_);
    local_8980 = (stbi__jpeg *)pal._8_8_;
    goto LAB_001176a6;
  }
  sVar9 = stbi__get8(s);
  if ((sVar9 == 'B') && (sVar9 = stbi__get8(s), sVar9 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar17 = stbi__get32le(s);
    if (((0x38 < sVar17) || ((0x100010000001000U >> ((ulong)sVar17 & 0x3f) & 1) == 0)) &&
       ((sVar17 != 0x7c && (sVar17 != 0x6c)))) goto LAB_0011744b;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    pvVar27 = stbi__bmp_parse_header(s,(stbi__bmp_data *)value);
    if (pvVar27 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar18 = s->img_y;
    uVar23 = -uVar18;
    if (0 < (int)uVar18) {
      uVar23 = uVar18;
    }
    s->img_y = uVar23;
    if ((0x1000000 < uVar23) || (0x1000000 < s->img_x)) goto LAB_00119b62;
    uStack_88dc = 0xff;
    if (iStack_88f0 == 0xc) {
      if (0x17 < (int)value) goto LAB_00117fb3;
      uVar23 = ((iStack_88f4 - local_88d8) + -0x18) / 3;
LAB_00117ed6:
      if (uVar23 == 0) goto LAB_00117fb3;
      bVar57 = false;
LAB_00117efe:
      bVar8 = uStack_88e0 == 0xff000000;
      iVar16 = 4 - (uint)(uStack_88e0 == 0);
      asVar22 = value;
    }
    else {
      if ((int)value < 0x10) {
        uVar23 = iStack_88f4 - (local_88d8 + iStack_88f0) >> 2;
        goto LAB_00117ed6;
      }
LAB_00117fb3:
      iVar16 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) + s->callback_already_read
      ;
      if (iVar16 - 0x401U < 0xfffffc00) {
        pcVar26 = "bad header";
        goto LAB_001172c8;
      }
      if ((iStack_88f4 < iVar16) || (0x400 < iStack_88f4 - iVar16)) {
        pcVar26 = "bad offset";
        goto LAB_001172c8;
      }
      stbi__skip(s,iStack_88f4 - iVar16);
      uVar23 = 0;
      bVar57 = true;
      if (value != (stbi_uc  [4])0x18 || uStack_88e0 != 0xff000000) goto LAB_00117efe;
      bVar8 = true;
      iVar16 = 3;
      asVar22[0] = '\x18';
      asVar22[1] = '\0';
      asVar22[2] = '\0';
      asVar22[3] = '\0';
      bVar57 = true;
    }
    s->img_n = iVar16;
    if (2 < req_comp) {
      iVar16 = req_comp;
    }
    sVar17 = s->img_x;
    sVar19 = s->img_y;
    iVar21 = stbi__mad3sizes_valid(iVar16,sVar17,sVar19,0);
    if (iVar21 == 0) goto LAB_00119b62;
    local_8980 = (stbi__jpeg *)stbi__malloc_mad3(iVar16,sVar17,sVar19,0);
    if (local_8980 != (stbi__jpeg *)0x0) {
      if ((int)asVar22 < 0x10) {
        if (!bVar57 && (int)uVar23 < 0x101) {
          uVar40 = 0;
          uVar51 = 0;
          if (0 < (int)uVar23) {
            uVar51 = (ulong)uVar23;
          }
          for (; uVar51 != uVar40; uVar40 = uVar40 + 1) {
            sVar9 = stbi__get8(s);
            pal[uVar40][2] = sVar9;
            sVar9 = stbi__get8(s);
            pal[uVar40][1] = sVar9;
            sVar9 = stbi__get8(s);
            pal[uVar40][0] = sVar9;
            if (iStack_88f0 != 0xc) {
              stbi__get8(s);
            }
            pal[uVar40][3] = 0xff;
          }
          stbi__skip(s,(uVar23 * (iStack_88f0 == 0xc | 0xfffffffc) + iStack_88f4) -
                       (iStack_88f0 + local_88d8));
          if (asVar22 == (stbi_uc  [4])0x1) {
            sVar19 = s->img_x;
            iVar21 = 0;
            uVar23 = 0;
LAB_001196ab:
            uVar40 = (ulong)uVar23;
            sVar17 = s->img_y;
            if (iVar21 < (int)sVar17) {
              iVar39 = 0;
              do {
                bVar15 = stbi__get8(s);
                sVar17 = s->img_x;
                iVar43 = 8;
                do {
                  uVar23 = (uint)uVar40;
                  if ((int)sVar17 <= iVar39) {
LAB_00119748:
                    stbi__skip(s,-(sVar19 + 7 >> 3) & 3);
                    iVar21 = iVar21 + 1;
                    goto LAB_001196ab;
                  }
                  bVar57 = (bVar15 >> (iVar43 - 1U & 0x1f) & 1) != 0;
                  lVar36 = (long)(int)uVar23;
                  uVar40 = lVar36 + 3;
                  *(stbi_uc *)((long)local_8980 + lVar36) = pal[bVar57][0];
                  *(stbi_uc *)((long)local_8980 + lVar36 + 1) = pal[bVar57][1];
                  *(stbi_uc *)((long)local_8980 + lVar36 + 2) = pal[bVar57][2];
                  if (iVar16 == 4) {
                    *(uchar *)((long)local_8980 + lVar36 + 3) = 0xff;
                    uVar40 = (ulong)(uVar23 + 4);
                  }
                  if (sVar17 - 1 == iVar39) {
                    uVar23 = (uint)uVar40;
                    goto LAB_00119748;
                  }
                  iVar39 = iVar39 + 1;
                  iVar47 = iVar43 + -1;
                  bVar57 = 0 < iVar43;
                  iVar43 = iVar47;
                } while (iVar47 != 0 && bVar57);
              } while( true );
            }
            local_8958 = 0xff;
            uStack_88dc = local_8958;
          }
          else {
            if (asVar22 == (stbi_uc  [4])0x8) {
              uVar23 = s->img_x;
            }
            else {
              if (asVar22 != (stbi_uc  [4])0x4) {
                free(local_8980);
                pcVar26 = "bad bpp";
                goto LAB_001172c8;
              }
              uVar23 = s->img_x + 1 >> 1;
            }
            local_8988._0_4_ = -uVar23 & 3;
            uVar40 = 0;
            for (iVar21 = 0; sVar17 = s->img_y, iVar21 < (int)sVar17; iVar21 = iVar21 + 1) {
              for (iVar39 = 0; iVar39 < (int)s->img_x; iVar39 = iVar39 + 2) {
                bVar15 = stbi__get8(s);
                uVar25 = bVar15 & 0xf;
                uVar23 = (uint)(bVar15 >> 4);
                if (asVar22 != (stbi_uc  [4])0x4) {
                  uVar23 = (uint)bVar15;
                }
                if (asVar22 != (stbi_uc  [4])0x4) {
                  uVar25 = 0;
                }
                lVar36 = (long)(int)uVar40;
                uVar51 = lVar36 + 3;
                *(stbi_uc *)((long)local_8980 + lVar36) = pal[uVar23][0];
                *(stbi_uc *)((long)local_8980 + lVar36 + 1) = pal[uVar23][1];
                *(stbi_uc *)((long)local_8980 + lVar36 + 2) = pal[uVar23][2];
                if (iVar16 == 4) {
                  *(uchar *)((long)local_8980 + lVar36 + 3) = 0xff;
                  uVar51 = (ulong)((int)uVar40 + 4);
                }
                if (iVar39 + 1U == s->img_x) {
                  uVar40 = uVar51 & 0xffffffff;
                  break;
                }
                if (asVar22 == (stbi_uc  [4])0x8) {
                  bVar15 = stbi__get8(s);
                  uVar25 = (uint)bVar15;
                }
                lVar36 = (long)(int)uVar51;
                uVar40 = lVar36 + 3;
                *(stbi_uc *)((long)local_8980 + lVar36) = pal[uVar25][0];
                *(stbi_uc *)((long)local_8980 + lVar36 + 1) = pal[uVar25][1];
                *(stbi_uc *)((long)local_8980 + lVar36 + 2) = pal[uVar25][2];
                if (iVar16 == 4) {
                  *(uchar *)((long)local_8980 + lVar36 + 3) = 0xff;
                  uVar40 = (ulong)((int)uVar51 + 4);
                }
              }
              stbi__skip(s,(uint)local_8988);
            }
          }
          goto LAB_001193ae;
        }
        free(local_8980);
        pcVar26 = "invalid";
        goto LAB_001172c8;
      }
      stbi__skip(s,iStack_88f4 - (iStack_88f0 + local_88d8));
      if (asVar22 != (stbi_uc  [4])0x10) {
        if (asVar22 == (stbi_uc  [4])0x20) {
          local_88fc = 0;
          if ((bool)(bVar8 & (uStack_88ec == 0xff0000 &&
                             (local_88e8 == 0xff00 && uStack_88e4 == 0xff)))) {
            bVar57 = true;
            goto LAB_00118f47;
          }
          goto LAB_00118fa1;
        }
        local_88fc = 0;
        if (asVar22 != (stbi_uc  [4])0x18) goto LAB_00118fa1;
        local_88fc = s->img_x & 3;
        bVar57 = false;
LAB_00118f47:
        bVar8 = false;
        iVar47 = 0;
        iVar21 = 0;
        iVar39 = 0;
        iVar43 = 0;
        uVar23 = 0;
        local_890c = 0;
        local_88bc = 0;
        local_88c8 = 0;
LAB_001191cc:
        local_8988._0_4_ = 0;
        for (iVar38 = 0; sVar17 = s->img_y, iVar38 < (int)sVar17; iVar38 = iVar38 + 1) {
          if (bVar8) {
            for (iVar50 = 0; iVar50 < (int)s->img_x; iVar50 = iVar50 + 1) {
              if (asVar22 == (stbi_uc  [4])0x10) {
                uVar25 = stbi__get16le(s);
              }
              else {
                uVar25 = stbi__get32le(s);
              }
              iVar24 = stbi__shiftsigned(uVar25 & uStack_88ec,iVar47,uVar23);
              lVar36 = (long)(int)(uint)local_8988;
              *(uchar *)((long)local_8980 + lVar36) = (uchar)iVar24;
              iVar24 = stbi__shiftsigned(uVar25 & local_88e8,iVar21,local_890c);
              *(uchar *)((long)local_8980 + lVar36 + 1) = (uchar)iVar24;
              iVar24 = stbi__shiftsigned(uVar25 & uStack_88e4,iVar39,local_88bc);
              *(uchar *)((long)local_8980 + lVar36 + 2) = (uchar)iVar24;
              if (uStack_88e0 == 0) {
                uVar25 = 0xff;
              }
              else {
                uVar25 = stbi__shiftsigned(uVar25 & uStack_88e0,iVar43,local_88c8);
              }
              iVar24 = (uint)local_8988 + 3;
              if (iVar16 == 4) {
                *(uchar *)((long)local_8980 + lVar36 + 3) = (uchar)uVar25;
                iVar24 = (uint)local_8988 + 4;
              }
              local_8988._0_4_ = iVar24;
              uStack_88dc = uStack_88dc | uVar25;
            }
          }
          else {
            for (iVar50 = 0; iVar50 < (int)s->img_x; iVar50 = iVar50 + 1) {
              sVar9 = stbi__get8(s);
              lVar36 = (long)(int)(uint)local_8988;
              *(stbi_uc *)((long)local_8980 + lVar36 + 2) = sVar9;
              sVar9 = stbi__get8(s);
              *(stbi_uc *)((long)local_8980 + lVar36 + 1) = sVar9;
              sVar9 = stbi__get8(s);
              *(stbi_uc *)((long)local_8980 + lVar36) = sVar9;
              bVar15 = 0xff;
              if (bVar57) {
                bVar15 = stbi__get8(s);
              }
              iVar24 = (uint)local_8988 + 3;
              if (iVar16 == 4) {
                *(byte *)((long)local_8980 + lVar36 + 3) = bVar15;
                iVar24 = (uint)local_8988 + 4;
              }
              local_8988._0_4_ = iVar24;
              uStack_88dc = uStack_88dc | bVar15;
            }
          }
          stbi__skip(s,local_88fc);
        }
LAB_001193ae:
        if ((iVar16 == 4) && (uStack_88dc == 0)) {
          for (uVar23 = s->img_x * sVar17 * 4 - 1; -1 < (int)uVar23; uVar23 = uVar23 - 4) {
            *(uchar *)((long)local_8980 + (ulong)uVar23) = 0xff;
          }
        }
        if (0 < (int)uVar18) {
          iVar21 = (int)sVar17 >> 1;
          if ((int)sVar17 >> 1 < 1) {
            iVar21 = 0;
          }
          iVar39 = (sVar17 - 1) * iVar16;
          iVar47 = 0;
          for (iVar43 = 0; iVar43 != iVar21; iVar43 = iVar43 + 1) {
            sVar19 = s->img_x;
            uVar40 = (ulong)(sVar19 * iVar16);
            if ((int)(sVar19 * iVar16) < 1) {
              uVar40 = 0;
            }
            for (uVar51 = 0; uVar40 != uVar51; uVar51 = uVar51 + 1) {
              uVar2 = *(uchar *)((long)local_8980 + uVar51 + sVar19 * iVar47);
              *(uchar *)((long)local_8980 + uVar51 + sVar19 * iVar47) =
                   *(uchar *)((long)local_8980 + uVar51 + sVar19 * iVar39);
              *(uchar *)((long)local_8980 + uVar51 + sVar19 * iVar39) = uVar2;
            }
            iVar39 = iVar39 - iVar16;
            iVar47 = iVar47 + iVar16;
          }
        }
        uVar18 = s->img_x;
        if ((req_comp != 0) && (iVar16 != req_comp)) {
          local_8980 = (stbi__jpeg *)
                       stbi__convert_format((uchar *)local_8980,iVar16,req_comp,uVar18,sVar17);
          if (local_8980 == (stbi__jpeg *)0x0) {
            return (void *)0x0;
          }
          uVar18 = s->img_x;
        }
        *x = uVar18;
        *y = s->img_y;
        if (comp != (int *)0x0) {
          *comp = s->img_n;
          return (uchar *)local_8980;
        }
        return (uchar *)local_8980;
      }
      local_88fc = s->img_x * 2 & 2;
LAB_00118fa1:
      if ((local_88e8 != 0 && uStack_88ec != 0) && uStack_88e4 != 0) {
        iVar47 = stbi__high_bit(uStack_88ec);
        uVar23 = stbi__bitcount(uStack_88ec);
        iVar21 = stbi__high_bit(local_88e8);
        local_890c = stbi__bitcount(local_88e8);
        iVar39 = stbi__high_bit(uStack_88e4);
        local_88bc = stbi__bitcount(uStack_88e4);
        iVar43 = stbi__high_bit(uStack_88e0);
        local_88c8 = stbi__bitcount(uStack_88e0);
        if ((local_88bc < 9 && (local_890c < 9 && uVar23 < 9)) && local_88c8 < 9) {
          iVar47 = iVar47 + -7;
          iVar21 = iVar21 + -7;
          iVar39 = iVar39 + -7;
          iVar43 = iVar43 + -7;
          bVar8 = true;
          bVar57 = false;
          goto LAB_001191cc;
        }
      }
      free(local_8980);
      pcVar26 = "bad masks";
      goto LAB_001172c8;
    }
LAB_00118c53:
    pcVar26 = "outofmem";
    goto LAB_001172c8;
  }
LAB_0011744b:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar16 = stbi__gif_test(s);
  if (iVar16 != 0) {
    memset((stbi__gif *)pal,0,0x8870);
    psVar28 = (stbi__context *)stbi__gif_load_next(s,(stbi__gif *)pal,comp,0,psVar56);
    if (psVar28 == (stbi__context *)0x0 || psVar28 == s) {
      free((void *)pal._8_8_);
      psVar28 = (stbi__context *)0x0;
    }
    else {
      *x = (int)pal[0];
      *y = (int)pal[1];
      if ((req_comp & 0xfffffffbU) != 0) {
        psVar28 = (stbi__context *)
                  stbi__convert_format((uchar *)psVar28,4,req_comp,(uint)pal[0],(uint)pal[1]);
      }
    }
    free((void *)pal._24_8_);
    local_8980 = (stbi__jpeg *)pal._16_8_;
    goto LAB_001176a6;
  }
  sVar17 = stbi__get32be(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar17 == 0x38425053) {
    sVar17 = stbi__get32be(s);
    if (sVar17 != 0x38425053) {
      pcVar26 = "not PSD";
      goto LAB_001172c8;
    }
    iVar16 = stbi__get16be(s);
    if (iVar16 != 1) {
      pcVar26 = "wrong version";
      goto LAB_001172c8;
    }
    stbi__skip(s,6);
    uVar18 = stbi__get16be(s);
    if (0x10 < uVar18) {
      pcVar26 = "wrong channel count";
      goto LAB_001172c8;
    }
    sVar17 = stbi__get32be(s);
    sVar19 = stbi__get32be(s);
    if (((int)sVar17 < 0x1000001) && ((int)sVar19 < 0x1000001)) {
      iVar16 = stbi__get16be(s);
      if ((iVar16 != 8) && (iVar16 != 0x10)) {
        pcVar26 = "unsupported bit depth";
        goto LAB_001172c8;
      }
      iVar21 = stbi__get16be(s);
      if (iVar21 != 3) {
        pcVar26 = "wrong color format";
        goto LAB_001172c8;
      }
      sVar20 = stbi__get32be(s);
      stbi__skip(s,sVar20);
      sVar20 = stbi__get32be(s);
      stbi__skip(s,sVar20);
      sVar20 = stbi__get32be(s);
      stbi__skip(s,sVar20);
      uVar23 = stbi__get16be(s);
      if (1 < uVar23) {
        pcVar26 = "bad compression";
        goto LAB_001172c8;
      }
      iVar21 = stbi__mad3sizes_valid(4,sVar19,sVar17,0);
      if (iVar21 != 0) {
        if (((bpc == 0x10) && (iVar16 == 0x10)) && (uVar23 == 0)) {
          local_8980 = (stbi__jpeg *)stbi__malloc_mad3(8,sVar19,sVar17,0);
          ri->bits_per_channel = 0x10;
        }
        else {
          local_8980 = (stbi__jpeg *)malloc((long)(int)(sVar17 * sVar19 * 4));
        }
        if (local_8980 != (stbi__jpeg *)0x0) {
          uVar25 = sVar19 * sVar17;
          if (uVar23 == 0) {
            uVar40 = 0;
            psVar30 = (stbi__uint16 *)local_8980;
            local_8988 = (stbi__uint16 *)local_8980;
            uVar23 = 0;
            if (0 < (int)uVar25) {
              uVar23 = uVar25;
            }
            for (; uVar40 != 4; uVar40 = uVar40 + 1) {
              if (uVar40 < uVar18) {
                if (ri->bits_per_channel == 0x10) {
                  for (lVar36 = 0; uVar23 != (uint)lVar36; lVar36 = lVar36 + 1) {
                    iVar21 = stbi__get16be(s);
                    local_8988[lVar36 * 4] = (stbi__uint16)iVar21;
                  }
                }
                else {
                  lVar36 = 0;
                  if (iVar16 == 0x10) {
                    for (; uVar23 != (uint)lVar36; lVar36 = lVar36 + 1) {
                      iVar21 = stbi__get16be(s);
                      *(char *)(psVar30 + lVar36 * 2) = (char)((uint)iVar21 >> 8);
                    }
                  }
                  else {
                    for (; uVar23 != (uint)lVar36; lVar36 = lVar36 + 1) {
                      sVar9 = stbi__get8(s);
                      *(stbi_uc *)(psVar30 + lVar36 * 2) = sVar9;
                    }
                  }
                }
              }
              else if (iVar16 == 0x10 && bpc == 0x10) {
                for (lVar36 = 0; uVar23 != (uint)lVar36; lVar36 = lVar36 + 1) {
                  local_8988[lVar36 * 4] = -(ushort)(uVar40 == 3);
                }
              }
              else {
                for (lVar36 = 0; uVar23 != (uint)lVar36; lVar36 = lVar36 + 1) {
                  *(char *)(psVar30 + lVar36 * 2) = -(uVar40 == 3);
                }
              }
              psVar30 = (stbi__uint16 *)((long)psVar30 + 1);
              local_8988 = local_8988 + 1;
            }
          }
          else {
            stbi__skip(s,sVar17 * uVar18 * 2);
            uVar40 = 0;
            psVar30 = (stbi__uint16 *)local_8980;
            uVar23 = 0;
            if (0 < (int)uVar25) {
              uVar23 = uVar25;
            }
            for (; uVar40 != 4; uVar40 = uVar40 + 1) {
              if (uVar40 < uVar18) {
                psVar56 = (stbi_uc *)((long)local_8980 + uVar40);
                iVar16 = 0;
                do {
                  uVar48 = uVar25 - iVar16;
                  do {
                    if ((int)uVar48 < 1) goto LAB_001198de;
                    bVar15 = stbi__get8(s);
                  } while (bVar15 == 0x80);
                  uVar52 = (uint)bVar15;
                  if ((char)bVar15 < '\0') {
                    uVar49 = 0x101 - uVar52;
                    if (uVar48 < uVar49) goto LAB_00119f61;
                    sVar9 = stbi__get8(s);
                    for (iVar21 = uVar52 - 0x101; iVar21 != 0; iVar21 = iVar21 + 1) {
                      *psVar56 = sVar9;
                      psVar56 = psVar56 + 4;
                    }
                  }
                  else {
                    if (uVar48 <= bVar15) {
LAB_00119f61:
                      free(local_8980);
                      pcVar26 = "corrupt";
                      goto LAB_001172c8;
                    }
                    uVar49 = uVar52 + 1;
                    uVar48 = uVar49;
                    while (bVar57 = uVar48 != 0, uVar48 = uVar48 - 1, bVar57) {
                      sVar9 = stbi__get8(s);
                      *psVar56 = sVar9;
                      psVar56 = psVar56 + 4;
                    }
                  }
                  iVar16 = iVar16 + uVar49;
                } while( true );
              }
              for (lVar36 = 0; uVar23 != (uint)lVar36; lVar36 = lVar36 + 1) {
                *(char *)(psVar30 + lVar36 * 2) = -(uVar40 == 3);
              }
LAB_001198de:
              psVar30 = (stbi__uint16 *)((long)psVar30 + 1);
            }
          }
          if (3 < uVar18) {
            uVar40 = 0;
            if (0 < (int)uVar25) {
              uVar40 = (ulong)uVar25;
            }
            if (ri->bits_per_channel == 0x10) {
              for (uVar51 = 0; uVar40 != uVar51; uVar51 = uVar51 + 1) {
                uVar5 = *(ushort *)((long)local_8980 + (uVar51 * 4 + 3) * 2);
                if ((uVar5 != 0) && (uVar5 != 0xffff)) {
                  fVar59 = 1.0 / ((float)uVar5 / 65535.0);
                  fVar58 = (1.0 - fVar59) * 65535.0;
                  auVar60._0_4_ =
                       (int)(fVar58 + fVar59 * (float)(*(uint *)((long)local_8980 + uVar51 * 4 * 2)
                                                      & 0xffff));
                  auVar60._4_4_ =
                       (int)(fVar58 + fVar59 * (float)(*(uint *)((long)local_8980 + uVar51 * 4 * 2)
                                                      >> 0x10));
                  auVar60._8_4_ = (int)(fVar58 + fVar59 * 0.0);
                  auVar60._12_4_ = (int)(fVar58 + fVar59 * 0.0);
                  auVar60 = pshuflw(auVar60,auVar60,0xe8);
                  *(int *)((long)local_8980 + uVar51 * 4 * 2) = auVar60._0_4_;
                  *(stbi__uint16 *)((long)local_8980 + (uVar51 * 4 + 2) * 2) =
                       (stbi__uint16)
                       (int)((float)*(ushort *)((long)local_8980 + (uVar51 * 4 + 2) * 2) * fVar59 +
                            fVar58);
                }
              }
            }
            else {
              for (uVar51 = 0; uVar40 != uVar51; uVar51 = uVar51 + 1) {
                bVar15 = *(byte *)((long)local_8980 + uVar51 * 4 + 3);
                if ((bVar15 != 0) && (bVar15 != 0xff)) {
                  fVar59 = 1.0 / ((float)bVar15 / 255.0);
                  fVar58 = (1.0 - fVar59) * 255.0;
                  *(char *)((long)local_8980 + uVar51 * 2 * 2) =
                       (char)(int)((float)(byte)*(stbi__uint16 *)((long)local_8980 + uVar51 * 2 * 2)
                                   * fVar59 + fVar58);
                  *(char *)((long)local_8980 + uVar51 * 4 + 1) =
                       (char)(int)((float)*(byte *)((long)local_8980 + uVar51 * 4 + 1) * fVar59 +
                                  fVar58);
                  *(char *)((long)local_8980 + (uVar51 * 2 + 1) * 2) =
                       (char)(int)((float)(byte)*(stbi__uint16 *)
                                                 ((long)local_8980 + (uVar51 * 2 + 1) * 2) * fVar59
                                  + fVar58);
                }
              }
            }
          }
          if ((req_comp & 0xfffffffbU) != 0) {
            if (ri->bits_per_channel == 0x10) {
              local_8980 = (stbi__jpeg *)
                           stbi__convert_format16
                                     ((stbi__uint16 *)local_8980,4,req_comp,sVar19,sVar17);
            }
            else {
              local_8980 = (stbi__jpeg *)
                           stbi__convert_format((uchar *)local_8980,4,req_comp,sVar19,sVar17);
            }
            if (local_8980 == (stbi__jpeg *)0x0) {
              return (void *)0x0;
            }
          }
          if (comp != (int *)0x0) {
            *comp = 4;
          }
          *y = sVar17;
          *x = sVar19;
          return (stbi__uint16 *)local_8980;
        }
        goto LAB_00118c53;
      }
    }
LAB_00119b62:
    pcVar26 = "too large";
    goto LAB_001172c8;
  }
  iVar16 = stbi__pic_is4(s,anon_var_dwarf_37a55);
  iVar21 = (int)psVar56;
  if (iVar16 == 0) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
  }
  else {
    iVar16 = 0x54;
    while( true ) {
      iVar21 = (int)psVar56;
      bVar57 = iVar16 == 0;
      iVar16 = iVar16 + -1;
      if (bVar57) break;
      stbi__get8(s);
    }
    iVar16 = stbi__pic_is4(s,"PICT");
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar16 != 0) {
      iVar16 = 0x5c;
      while (bVar57 = iVar16 != 0, iVar16 = iVar16 + -1, bVar57) {
        stbi__get8(s);
      }
      uVar18 = stbi__get16be(s);
      uVar23 = stbi__get16be(s);
      iVar16 = stbi__at_eof(s);
      if (iVar16 != 0) {
        pcVar26 = "bad file";
        goto LAB_001172c8;
      }
      iVar16 = stbi__mad3sizes_valid(uVar18,uVar23,4,0);
      if (iVar16 != 0) {
        stbi__get32be(s);
        stbi__get16be(s);
        stbi__get16be(s);
        local_8980 = (stbi__jpeg *)stbi__malloc_mad3(uVar18,uVar23,4,0);
        if (local_8980 != (stbi__jpeg *)0x0) {
          memset(local_8980,0xff,(ulong)(uVar18 * 4 * uVar23));
          psVar56 = pal[0] + 2;
          lVar36 = 0;
          uVar25 = uVar23;
          uVar48 = 0;
          while( true ) {
            if (lVar36 == 10) {
              *(char **)(in_FS_OFFSET + -0x20) = "bad format";
              goto LAB_001194c2;
            }
            sVar9 = stbi__get8(s);
            bVar15 = stbi__get8(s);
            (*(stbi_uc (*) [4])(psVar56 + -2))[0] = bVar15;
            bVar11 = stbi__get8(s);
            psVar56[-1] = bVar11;
            bVar11 = stbi__get8(s);
            *psVar56 = bVar11;
            iVar16 = stbi__at_eof(s);
            uVar25 = uVar48;
            if (iVar16 != 0) break;
            if (bVar15 != 8) {
              pcVar26 = "bad format";
              goto LAB_00118db9;
            }
            uVar48 = uVar48 | bVar11;
            psVar56 = psVar56 + 3;
            lVar36 = lVar36 + 1;
            if (sVar9 == '\0') goto code_r0x00117b93;
          }
          pcVar26 = "bad file";
LAB_00118db9:
          *(char **)(in_FS_OFFSET + -0x20) = pcVar26;
LAB_001194c2:
          free(local_8980);
          local_8980 = (stbi__jpeg *)0x0;
          goto LAB_001194eb;
        }
        goto LAB_00118c53;
      }
      goto LAB_00119b62;
    }
  }
  psVar29 = (stbi__jpeg *)calloc(1,0x4888);
  if (psVar29 == (stbi__jpeg *)0x0) {
    *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
LAB_001177e8:
    sVar9 = stbi__get8(s);
    sVar10 = stbi__get8(s);
    if ((sVar9 == 'P') && (0xfd < (byte)(sVar10 - 0x37))) {
      y_00 = &s->img_y;
      comp_00 = &s->img_n;
      iVar16 = stbi__pnm_info(s,(int *)s,(int *)y_00,comp_00);
      ri->bits_per_channel = iVar16;
      if (iVar16 == 0) {
        return (void *)0x0;
      }
      if ((*y_00 < 0x1000001) && (s->img_x < 0x1000001)) {
        *x = s->img_x;
        sVar17 = *y_00;
        *y = sVar17;
        iVar16 = *comp_00;
        if (comp != (int *)0x0) {
          *comp = iVar16;
          sVar17 = *y_00;
        }
        sVar19 = s->img_x;
        iVar39 = ri->bits_per_channel / 8;
        iVar43 = stbi__mad4sizes_valid(iVar16,sVar19,sVar17,iVar39,iVar21);
        if (iVar43 != 0) {
          psVar30 = (stbi__uint16 *)stbi__malloc_mad4(iVar16,sVar19,sVar17,iVar39,iVar21);
          if (psVar30 != (stbi__uint16 *)0x0) {
            iVar16 = stbi__getn(s,(stbi_uc *)psVar30,sVar17 * iVar16 * sVar19 * iVar39);
            if (iVar16 != 0) {
              if (req_comp == 0) {
                return psVar30;
              }
              iVar16 = *comp_00;
              if (iVar16 != req_comp) {
                if (ri->bits_per_channel == 0x10) {
                  psVar30 = stbi__convert_format16(psVar30,iVar16,req_comp,s->img_x,s->img_y);
                  return psVar30;
                }
                puVar33 = stbi__convert_format((uchar *)psVar30,iVar16,req_comp,s->img_x,s->img_y);
                return puVar33;
              }
              return psVar30;
            }
            free(psVar30);
            pcVar26 = "bad PNM";
            goto LAB_001172c8;
          }
          goto LAB_00118c53;
        }
      }
      goto LAB_00119b62;
    }
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    iVar16 = stbi__hdr_test(s);
    if (iVar16 != 0) {
      local_8980 = (stbi__jpeg *)stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
      if (req_comp == 0) {
        req_comp = *comp;
      }
      if (local_8980 == (stbi__jpeg *)0x0) {
        return (void *)0x0;
      }
      iVar16 = *x;
      iVar21 = *y;
      psVar28 = (stbi__context *)stbi__malloc_mad3(iVar16,iVar21,req_comp,0);
      if (psVar28 != (stbi__context *)0x0) {
        uVar23 = (req_comp + (req_comp & 1U)) - 1;
        uVar18 = iVar21 * iVar16;
        uVar40 = (ulong)uVar23;
        if ((int)uVar23 < 1) {
          uVar40 = 0;
        }
        lVar36 = (long)req_comp;
        uVar51 = (ulong)uVar18;
        if ((int)uVar18 < 1) {
          uVar51 = 0;
        }
        psVar42 = psVar28;
        psVar29 = local_8980;
        for (uVar53 = 0; uVar53 != uVar51; uVar53 = uVar53 + 1) {
          for (uVar41 = 0; uVar40 != uVar41; uVar41 = uVar41 + 1) {
            fVar58 = powf(*(float *)(psVar29->huff_dc[0].fast + uVar41 * 4 + -8) * stbi__h2l_scale_i
                          ,stbi__h2l_gamma_i);
            fVar59 = fVar58 * 255.0 + 0.5;
            fVar58 = 0.0;
            if (0.0 <= fVar59) {
              fVar58 = fVar59;
            }
            fVar59 = 255.0;
            if (fVar58 <= 255.0) {
              fVar59 = fVar58;
            }
            psVar42->buffer_start[uVar41 + -0x38] = (stbi_uc)(int)fVar59;
          }
          if ((int)uVar40 < req_comp) {
            lVar32 = uVar53 * lVar36 + uVar40;
            fVar59 = *(float *)(local_8980->huff_dc[0].fast + lVar32 * 4 + -8) * 255.0 + 0.5;
            fVar58 = 0.0;
            if (0.0 <= fVar59) {
              fVar58 = fVar59;
            }
            fVar59 = 255.0;
            if (fVar58 <= 255.0) {
              fVar59 = fVar58;
            }
            psVar28->buffer_start[lVar32 + -0x38] = (stbi_uc)(int)fVar59;
          }
          psVar42 = (stbi__context *)(psVar42->buffer_start + lVar36 + -0x38);
          psVar29 = (stbi__jpeg *)(psVar29->huff_dc[0].fast + lVar36 * 4 + -8);
        }
        goto LAB_001176a6;
      }
LAB_00118c4e:
      free(local_8980);
      goto LAB_00118c53;
    }
    stbi__get8(s);
    bVar15 = stbi__get8(s);
    if (bVar15 < 2) {
      bVar11 = stbi__get8(s);
      if (bVar15 == 1) {
        if ((bVar11 & 0xf7) == 1) {
          iVar16 = 4;
          stbi__skip(s,4);
          bVar11 = stbi__get8(s);
          if ((bVar11 < 0x21) && ((0x101018100U >> ((ulong)bVar11 & 0x3f) & 1) != 0))
          goto LAB_00118cd7;
        }
        goto LAB_00118bda;
      }
      if ((bVar11 & 0xf6) != 2) goto LAB_00118bda;
      iVar16 = 9;
LAB_00118cd7:
      stbi__skip(s,iVar16);
      iVar16 = stbi__get16le(s);
      if ((iVar16 == 0) || (iVar16 = stbi__get16le(s), iVar16 == 0)) goto LAB_00118bda;
      bVar11 = stbi__get8(s);
      if (bVar15 != 1) {
        if ((bVar11 < 0x21) && ((0x101018100U >> ((ulong)bVar11 & 0x3f) & 1) != 0)) {
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          goto LAB_001190c3;
        }
        goto LAB_00118bda;
      }
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if ((bVar11 - 8 & 0xf7) == 0) {
LAB_001190c3:
        bVar11 = stbi__get8(s);
        sVar9 = stbi__get8(s);
        bVar12 = stbi__get8(s);
        iVar16 = stbi__get16le(s);
        uVar48 = stbi__get16le(s);
        bVar15 = stbi__get8(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar18 = stbi__get16le(s);
        uVar23 = stbi__get16le(s);
        bVar13 = stbi__get8(s);
        pal._0_8_ = (ulong)(uint)pal[1] << 0x20;
        bVar14 = stbi__get8(s);
        _value = (stbi_uc *)((ulong)_value & 0xffffffff00000000);
        if (sVar9 == '\0') {
          uVar25 = bVar12 - 8;
          if (bVar12 < 8) {
            uVar25 = (uint)bVar12;
          }
          uVar25 = (uint)(uVar25 == 3);
          bVar15 = bVar13;
        }
        else {
          uVar25 = 0;
        }
        uVar25 = stbi__tga_get_comp((uint)bVar15,uVar25,(int *)pal);
        if (uVar25 == 0) {
          pcVar26 = "bad format";
          goto LAB_001172c8;
        }
        *x = uVar18;
        *y = uVar23;
        if (comp != (int *)0x0) {
          *comp = uVar25;
        }
        iVar21 = stbi__mad3sizes_valid(uVar18,uVar23,uVar25,0);
        if (iVar21 == 0) goto LAB_00119b62;
        local_8980 = (stbi__jpeg *)stbi__malloc_mad3(uVar18,uVar23,uVar25,0);
        if (local_8980 == (stbi__jpeg *)0x0) goto LAB_00118c53;
        stbi__skip(s,(uint)bVar11);
        uVar40 = (ulong)uVar25;
        if (((sVar9 == '\0') && (bVar12 < 8)) && (pal[0] == (stbi_uc  [4])0x0)) {
          uVar52 = 0;
          uVar48 = uVar23;
          while (uVar48 = uVar48 - 1, uVar48 != 0xffffffff) {
            uVar49 = uVar52;
            if ((bVar14 >> 5 & 1) == 0) {
              uVar49 = uVar48;
            }
            stbi__getn(s,local_8980->huff_dc[0].fast + (long)(int)(uVar49 * uVar25 * uVar18) + -8,
                       uVar25 * uVar18);
            uVar52 = uVar52 + 1;
          }
        }
        else {
          if (sVar9 == '\0') {
            local_8968 = (stbi__jpeg *)0x0;
          }
          else {
            if (uVar48 == 0) {
LAB_0011a96f:
              free(local_8980);
              pcVar26 = "bad palette";
              goto LAB_001172c8;
            }
            stbi__skip(s,iVar16);
            local_8968 = (stbi__jpeg *)stbi__malloc_mad2(uVar48,uVar25,0);
            if (local_8968 == (stbi__jpeg *)0x0) goto LAB_00118c4e;
            if (pal[0] == (stbi_uc  [4])0x0) {
              iVar16 = stbi__getn(s,(stbi_uc *)local_8968,uVar25 * uVar48);
              if (iVar16 == 0) {
                free(local_8980);
                local_8980 = local_8968;
                goto LAB_0011a96f;
              }
            }
            else {
              if (uVar25 != 3) {
                __assert_fail("tga_comp == STBI_rgb",
                              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/stb/stb_image.h"
                              ,0x1745,
                              "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                             );
              }
              for (lVar36 = 0; uVar48 * 3 != (int)lVar36; lVar36 = lVar36 + 3) {
                stbi__tga_read_rgb16(s,local_8968->huff_dc[0].fast + lVar36 + -8);
              }
            }
          }
          bVar57 = true;
          iVar16 = 0;
          uVar52 = 0;
          psVar29 = local_8980;
          for (uVar51 = 0; uVar51 != uVar23 * uVar18; uVar51 = uVar51 + 1) {
            if (bVar12 < 8) {
LAB_0011a7cd:
              if (sVar9 == '\0') {
                if (pal[0] == (stbi_uc  [4])0x0) {
                  for (uVar53 = 0; uVar40 != uVar53; uVar53 = uVar53 + 1) {
                    sVar10 = stbi__get8(s);
                    value[uVar53] = sVar10;
                  }
                }
                else {
                  if (uVar25 != 3) {
                    __assert_fail("tga_comp == STBI_rgb",
                                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/stb/stb_image.h"
                                  ,0x1776,
                                  "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                                 );
                  }
                  stbi__tga_read_rgb16(s,value);
                }
              }
              else {
                if (bVar13 == 8) {
                  bVar15 = stbi__get8(s);
                  uVar49 = (uint)bVar15;
                }
                else {
                  uVar49 = stbi__get16le(s);
                }
                if (uVar48 <= uVar49) {
                  uVar49 = 0;
                }
                for (uVar53 = 0; uVar40 != uVar53; uVar53 = uVar53 + 1) {
                  value[uVar53] = local_8968->huff_dc[0].fast[uVar53 + uVar49 * uVar25 + -8];
                }
              }
            }
            else {
              if (iVar16 == 0) {
                bVar15 = stbi__get8(s);
                iVar16 = (bVar15 & 0x7f) + 1;
                uVar52 = (uint)(bVar15 >> 7);
                goto LAB_0011a7cd;
              }
              if (uVar52 == 0 || bVar57) {
                uVar52 = (uint)(uVar52 != 0);
                goto LAB_0011a7cd;
              }
              uVar52 = 1;
            }
            for (uVar53 = 0; uVar40 != uVar53; uVar53 = uVar53 + 1) {
              psVar29->huff_dc[0].fast[uVar53 - 8] = value[uVar53];
            }
            iVar16 = iVar16 + -1;
            psVar29 = (stbi__jpeg *)(psVar29->huff_dc[0].fast + (uVar40 - 8));
            bVar57 = false;
          }
          if ((bVar14 >> 5 & 1) == 0) {
            iVar16 = uVar25 * uVar18;
            iVar21 = (uVar23 - 1) * iVar16;
            uVar48 = 0;
            for (uVar52 = 0; uVar52 != uVar23 + 1 >> 1; uVar52 = uVar52 + 1) {
              psVar29 = local_8980;
              for (iVar39 = iVar16; 0 < iVar39; iVar39 = iVar39 + -1) {
                sVar9 = psVar29->huff_dc[0].fast[(ulong)uVar48 - 8];
                psVar29->huff_dc[0].fast[(ulong)uVar48 - 8] =
                     psVar29->huff_dc[0].fast[(long)iVar21 + -8];
                psVar29->huff_dc[0].fast[(long)iVar21 + -8] = sVar9;
                psVar29 = (stbi__jpeg *)((long)&psVar29->s + 1);
              }
              uVar48 = uVar48 + iVar16;
              iVar21 = iVar21 - iVar16;
            }
          }
          free(local_8968);
        }
        if ((2 < uVar25) && (pal[0] == (stbi_uc  [4])0x0)) {
          iVar16 = uVar23 * uVar18;
          puVar44 = (undefined1 *)((long)&local_8980->s + 2);
          while (bVar57 = iVar16 != 0, iVar16 = iVar16 + -1, bVar57) {
            uVar3 = puVar44[-2];
            puVar44[-2] = *puVar44;
            *puVar44 = uVar3;
            puVar44 = puVar44 + uVar40;
          }
        }
        if (req_comp == 0) {
          return local_8980;
        }
        if (uVar25 == req_comp) {
          return local_8980;
        }
LAB_00119515:
        puVar33 = stbi__convert_format((uchar *)local_8980,uVar25,req_comp,uVar18,uVar23);
        return puVar33;
      }
    }
    else {
LAB_00118bda:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
    }
    pcVar26 = "unknown image type";
LAB_001172c8:
    *(char **)(in_FS_OFFSET + -0x20) = pcVar26;
    return (void *)0x0;
  }
  psVar29->s = s;
  psVar29->idct_block_kernel = stbi__idct_simd;
  psVar29->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar29->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  iVar16 = stbi__decode_jpeg_header(psVar29,1);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar29);
  if (iVar16 == 0) goto LAB_001177e8;
  local_8980 = (stbi__jpeg *)calloc(1,0x4888);
  if (local_8980 == (stbi__jpeg *)0x0) goto LAB_00118c53;
  local_8980->s = s;
  local_8980->idct_block_kernel = stbi__idct_simd;
  local_8980->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  local_8980->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  s->img_n = 0;
  if ((uint)req_comp < 5) {
    for (lVar36 = 0x46d8; lVar36 != 0x4858; lVar36 = lVar36 + 0x60) {
      psVar56 = local_8980->huff_dc[0].fast + lVar36 + -8;
      psVar56[0] = '\0';
      psVar56[1] = '\0';
      psVar56[2] = '\0';
      psVar56[3] = '\0';
      psVar56[4] = '\0';
      psVar56[5] = '\0';
      psVar56[6] = '\0';
      psVar56[7] = '\0';
      psVar56[8] = '\0';
      psVar56[9] = '\0';
      psVar56[10] = '\0';
      psVar56[0xb] = '\0';
      psVar56[0xc] = '\0';
      psVar56[0xd] = '\0';
      psVar56[0xe] = '\0';
      psVar56[0xf] = '\0';
    }
    local_8980->restart_interval = 0;
    iVar16 = stbi__decode_jpeg_header(local_8980,0);
    if (iVar16 != 0) {
      paVar1 = local_8980->img_comp;
      bVar15 = stbi__get_marker(local_8980);
      while (bVar15 == 0xda) {
        iVar16 = stbi__get16be(local_8980->s);
        bVar15 = stbi__get8(local_8980->s);
        uVar18 = (uint)bVar15;
        local_8980->scan_n = (uint)bVar15;
        if (((byte)(bVar15 - 5) < 0xfc) ||
           (psVar28 = local_8980->s, psVar28->img_n < (int)(uint)bVar15)) {
          pcVar26 = "bad SOS component count";
          goto LAB_00119bc3;
        }
        if (iVar16 != (uint)bVar15 * 2 + 6) {
          pcVar26 = "bad SOS len";
          goto LAB_00119bc3;
        }
        lVar36 = 0;
        while( true ) {
          bVar15 = stbi__get8(psVar28);
          if ((int)uVar18 <= lVar36) break;
          bVar11 = stbi__get8(local_8980->s);
          psVar28 = local_8980->s;
          uVar18 = psVar28->img_n;
          uVar40 = 0;
          if (0 < (int)uVar18) {
            uVar40 = (ulong)uVar18;
          }
          paVar45 = paVar1;
          for (uVar51 = 0; uVar40 != uVar51; uVar51 = uVar51 + 1) {
            if (paVar45->id == (uint)bVar15) {
              uVar40 = uVar51 & 0xffffffff;
              break;
            }
            paVar45 = paVar45 + 1;
          }
          if ((uint)uVar40 == uVar18) goto LAB_00119bcc;
          local_8980->img_comp[uVar40].hd = (uint)(bVar11 >> 4);
          if (0x3f < bVar11) {
            pcVar26 = "bad DC huff";
            goto LAB_00119bc3;
          }
          paVar1[uVar40].ha = bVar11 & 0xf;
          if (3 < (bVar11 & 0xf)) {
            pcVar26 = "bad AC huff";
            goto LAB_00119bc3;
          }
          local_8980->order[lVar36] = (uint)uVar40;
          lVar36 = lVar36 + 1;
          uVar18 = local_8980->scan_n;
        }
        local_8980->spec_start = (uint)bVar15;
        bVar15 = stbi__get8(local_8980->s);
        local_8980->spec_end = (uint)bVar15;
        bVar15 = stbi__get8(local_8980->s);
        local_8980->succ_high = (uint)(bVar15 >> 4);
        local_8980->succ_low = bVar15 & 0xf;
        iVar16 = local_8980->spec_start;
        if (local_8980->progressive == 0) {
          if ((iVar16 != 0) || ((0xf < bVar15 || ((bVar15 & 0xf) != 0)))) {
LAB_00119bbc:
            pcVar26 = "bad SOS";
            goto LAB_00119bc3;
          }
          local_8980->spec_end = 0x3f;
        }
        else if ((((0x3f < iVar16) || (0x3f < local_8980->spec_end)) ||
                 (local_8980->spec_end < iVar16)) || ((0xdf < bVar15 || (0xd < (bVar15 & 0xf)))))
        goto LAB_00119bbc;
        stbi__jpeg_reset(local_8980);
        if (local_8980->progressive != 0) {
          if (local_8980->scan_n == 1) {
            iVar16 = local_8980->order[0];
            iVar39 = local_8980->img_comp[iVar16].x + 7 >> 3;
            iVar21 = local_8980->img_comp[iVar16].y + 7 >> 3;
            iVar43 = 0;
            if (iVar39 < 1) {
              iVar39 = 0;
            }
            if (iVar21 < 1) {
              iVar21 = iVar43;
            }
            for (; iVar43 != iVar21; iVar43 = iVar43 + 1) {
              for (iVar47 = 0; iVar47 != iVar39; iVar47 = iVar47 + 1) {
                psVar55 = paVar1[iVar16].coeff + (paVar1[iVar16].coeff_w * iVar43 + iVar47) * 0x40;
                uVar40 = (ulong)local_8980->spec_start;
                if (uVar40 == 0) {
                  iVar38 = stbi__jpeg_decode_block_prog_dc
                                     (local_8980,psVar55,
                                      (stbi__huffman *)local_8980->huff_dc[paVar1[iVar16].hd].fast,
                                      iVar16);
                  if (iVar38 == 0) goto LAB_00119bcc;
                }
                else {
                  iVar38 = paVar1[iVar16].ha;
                  psVar56 = local_8980->huff_ac[iVar38].fast;
                  iVar50 = local_8980->eob_run;
                  bVar15 = (byte)local_8980->succ_low;
                  if (local_8980->succ_high == 0) {
                    if (iVar50 == 0) {
                      do {
                        if (local_8980->code_bits < 0x10) {
                          stbi__grow_buffer_unsafe(local_8980);
                        }
                        sVar37 = local_8980->fast_ac[iVar38][local_8980->code_buffer >> 0x17];
                        uVar18 = (uint)sVar37;
                        iVar50 = (int)uVar40;
                        if (sVar37 == 0) {
                          uVar18 = stbi__jpeg_huff_decode(local_8980,(stbi__huffman *)psVar56);
                          if ((int)uVar18 < 0) goto LAB_00119a37;
                          uVar23 = uVar18 >> 4;
                          if ((uVar18 & 0xf) == 0) {
                            if (uVar18 < 0xf0) {
                              iVar50 = 1 << ((byte)uVar23 & 0x1f);
                              local_8980->eob_run = iVar50;
                              if (0xf < uVar18) {
                                iVar50 = stbi__jpeg_get_bits(local_8980,uVar23);
                                iVar50 = iVar50 + local_8980->eob_run;
                              }
                              goto LAB_00118431;
                            }
                            uVar40 = (ulong)(iVar50 + 0x10);
                          }
                          else {
                            lVar36 = (ulong)uVar23 + (long)iVar50;
                            uVar40 = (ulong)((int)lVar36 + 1);
                            bVar11 = ""[lVar36];
                            iVar50 = stbi__extend_receive(local_8980,uVar18 & 0xf);
                            psVar55[bVar11] = (short)(iVar50 << (bVar15 & 0x1f));
                          }
                        }
                        else {
                          uVar23 = uVar18 & 0xf;
                          if (local_8980->code_bits < (int)uVar23) goto LAB_00119bb3;
                          lVar36 = (ulong)(uVar18 >> 4 & 0xf) + (long)iVar50;
                          local_8980->code_buffer = local_8980->code_buffer << (sbyte)uVar23;
                          local_8980->code_bits = local_8980->code_bits - uVar23;
                          uVar40 = (ulong)((int)lVar36 + 1);
                          psVar55[""[lVar36]] = (short)((uVar18 >> 8) << (bVar15 & 0x1f));
                        }
                      } while ((int)uVar40 <= local_8980->spec_end);
                    }
                    else {
LAB_00118431:
                      local_8980->eob_run = iVar50 + -1;
                    }
                  }
                  else if (iVar50 == 0) {
                    iVar38 = 0x10000 << (bVar15 & 0x1f);
                    do {
                      uVar18 = stbi__jpeg_huff_decode(local_8980,(stbi__huffman *)psVar56);
                      if ((int)uVar18 < 0) goto LAB_00119a37;
                      uVar23 = uVar18 >> 4;
                      if ((uVar18 & 0xf) == 1) {
                        iVar50 = stbi__jpeg_get_bit(local_8980);
                        iVar24 = 1;
                        if (iVar50 == 0) {
                          iVar24 = 0xffff;
                        }
                        sVar37 = (short)(iVar24 << (bVar15 & 0x1f));
                      }
                      else {
                        if ((uVar18 & 0xf) != 0) goto LAB_00119bb3;
                        if (uVar18 < 0xf0) {
                          local_8980->eob_run = ~(-1 << ((byte)uVar23 & 0x1f));
                          if (0xf < uVar18) {
                            iVar50 = stbi__jpeg_get_bits(local_8980,uVar23);
                            local_8980->eob_run = local_8980->eob_run + iVar50;
                          }
                          uVar23 = 0x40;
                        }
                        else {
                          uVar23 = 0xf;
                        }
                        sVar37 = 0;
                      }
                      uVar51 = (long)(int)uVar40;
                      do {
                        while( true ) {
                          uVar40 = uVar51;
                          iVar50 = local_8980->spec_end;
                          if ((long)iVar50 < (long)uVar40) goto LAB_00118560;
                          bVar11 = ""[uVar40];
                          if (psVar55[bVar11] == 0) break;
                          iVar50 = stbi__jpeg_get_bit(local_8980);
                          if ((iVar50 != 0) &&
                             (sVar4 = psVar55[bVar11], (iVar38 >> 0x10 & (int)sVar4) == 0)) {
                            sVar7 = (short)((uint)iVar38 >> 0x10);
                            if (sVar4 < 1) {
                              sVar7 = -sVar7;
                            }
                            psVar55[bVar11] = sVar4 + sVar7;
                          }
                          uVar51 = uVar40 + 1;
                        }
                        bVar57 = uVar23 != 0;
                        uVar23 = uVar23 - 1;
                        uVar51 = uVar40 + 1;
                      } while (bVar57);
                      psVar55[bVar11] = sVar37;
                      uVar40 = uVar40 + 1;
LAB_00118560:
                    } while ((int)uVar40 <= iVar50);
                  }
                  else {
                    local_8980->eob_run = iVar50 + -1;
                    uVar18 = (0x10000 << (bVar15 & 0x1f)) >> 0x10;
                    for (; (long)uVar40 <= (long)local_8980->spec_end; uVar40 = uVar40 + 1) {
                      bVar15 = ""[uVar40];
                      if (((psVar55[bVar15] != 0) &&
                          (iVar38 = stbi__jpeg_get_bit(local_8980), iVar38 != 0)) &&
                         (sVar37 = psVar55[bVar15], (uVar18 & (int)sVar37) == 0)) {
                        uVar23 = -uVar18;
                        if (0 < sVar37) {
                          uVar23 = uVar18;
                        }
                        psVar55[bVar15] = (short)uVar23 + sVar37;
                      }
                    }
                  }
                }
                iVar38 = local_8980->todo;
                local_8980->todo = iVar38 + -1;
                if (iVar38 < 2) {
                  if (local_8980->code_bits < 0x18) {
                    stbi__grow_buffer_unsafe(local_8980);
                  }
                  bVar15 = local_8980->marker;
                  if ((bVar15 & 0xf8) != 0xd0) goto LAB_00118b43;
                  stbi__jpeg_reset(local_8980);
                }
              }
            }
          }
          else {
            for (iVar16 = 0; iVar16 < local_8980->img_mcu_y; iVar16 = iVar16 + 1) {
              for (iVar21 = 0; iVar21 < local_8980->img_mcu_x; iVar21 = iVar21 + 1) {
                for (lVar36 = 0; lVar36 < local_8980->scan_n; lVar36 = lVar36 + 1) {
                  iVar39 = local_8980->order[lVar36];
                  for (iVar43 = 0; iVar43 < paVar1[iVar39].v; iVar43 = iVar43 + 1) {
                    iVar47 = 0;
                    while (iVar47 < paVar1[iVar39].h) {
                      iVar38 = stbi__jpeg_decode_block_prog_dc
                                         (local_8980,
                                          paVar1[iVar39].coeff +
                                          (paVar1[iVar39].h * iVar21 + iVar47 +
                                          (paVar1[iVar39].v * iVar16 + iVar43) *
                                          paVar1[iVar39].coeff_w) * 0x40,
                                          (stbi__huffman *)
                                          local_8980->huff_dc[paVar1[iVar39].hd].fast,iVar39);
                      iVar47 = iVar47 + 1;
                      if (iVar38 == 0) goto LAB_00119bcc;
                    }
                  }
                }
                iVar39 = local_8980->todo;
                local_8980->todo = iVar39 + -1;
                if (iVar39 < 2) {
                  if (local_8980->code_bits < 0x18) {
                    stbi__grow_buffer_unsafe(local_8980);
                  }
                  bVar15 = local_8980->marker;
                  if ((bVar15 & 0xf8) != 0xd0) goto LAB_00118b43;
                  stbi__jpeg_reset(local_8980);
                }
              }
            }
          }
          goto LAB_00118b3c;
        }
        if (local_8980->scan_n == 1) {
          iVar16 = local_8980->order[0];
          uVar18 = local_8980->img_comp[iVar16].x + 7 >> 3;
          iVar21 = local_8980->img_comp[iVar16].y + 7 >> 3;
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          iVar39 = 0;
          if (iVar21 < 1) {
            iVar21 = 0;
          }
          for (iVar43 = 0; iVar43 != iVar21; iVar43 = iVar43 + 1) {
            for (lVar36 = 0; (ulong)uVar18 * 8 != lVar36; lVar36 = lVar36 + 8) {
              iVar47 = stbi__jpeg_decode_block
                                 (local_8980,(short *)pal,
                                  (stbi__huffman *)local_8980->huff_dc[paVar1[iVar16].hd].fast,
                                  (stbi__huffman *)local_8980->huff_ac[paVar1[iVar16].ha].fast,
                                  local_8980->fast_ac[paVar1[iVar16].ha],iVar16,
                                  local_8980->dequant[paVar1[iVar16].tq]);
              if (iVar47 == 0) {
                bVar57 = false;
                goto LAB_00118b34;
              }
              (*local_8980->idct_block_kernel)
                        (paVar1[iVar16].data + lVar36 + iVar39 * paVar1[iVar16].w2,paVar1[iVar16].w2
                         ,(short *)pal);
              iVar47 = local_8980->todo;
              local_8980->todo = iVar47 + -1;
              if (iVar47 < 2) {
                if (local_8980->code_bits < 0x18) {
                  stbi__grow_buffer_unsafe(local_8980);
                }
                if ((local_8980->marker & 0xf8) != 0xd0) goto LAB_00118b31;
                stbi__jpeg_reset(local_8980);
              }
            }
            iVar39 = iVar39 + 8;
          }
LAB_00118b31:
          bVar57 = true;
        }
        else {
          for (iVar16 = 0; iVar16 < local_8980->img_mcu_y; iVar16 = iVar16 + 1) {
            for (iVar21 = 0; iVar21 < local_8980->img_mcu_x; iVar21 = iVar21 + 1) {
              for (lVar36 = 0; lVar36 < local_8980->scan_n; lVar36 = lVar36 + 1) {
                iVar39 = local_8980->order[lVar36];
                for (iVar43 = 0; iVar43 < paVar1[iVar39].v; iVar43 = iVar43 + 1) {
                  for (iVar47 = 0; iVar38 = paVar1[iVar39].h, iVar47 < iVar38; iVar47 = iVar47 + 1)
                  {
                    iVar50 = paVar1[iVar39].v;
                    iVar24 = stbi__jpeg_decode_block
                                       (local_8980,(short *)pal,
                                        (stbi__huffman *)local_8980->huff_dc[paVar1[iVar39].hd].fast
                                        ,(stbi__huffman *)
                                         local_8980->huff_ac[paVar1[iVar39].ha].fast,
                                        local_8980->fast_ac[paVar1[iVar39].ha],iVar39,
                                        local_8980->dequant[paVar1[iVar39].tq]);
                    if (iVar24 == 0) {
                      bVar57 = false;
                      goto LAB_00118b34;
                    }
                    (*local_8980->idct_block_kernel)
                              (paVar1[iVar39].data +
                               (long)((iVar38 * iVar21 + iVar47) * 8) +
                               (long)((iVar50 * iVar16 + iVar43) * paVar1[iVar39].w2 * 8),
                               paVar1[iVar39].w2,(short *)pal);
                  }
                }
              }
              iVar39 = local_8980->todo;
              local_8980->todo = iVar39 + -1;
              if (iVar39 < 2) {
                if (local_8980->code_bits < 0x18) {
                  stbi__grow_buffer_unsafe(local_8980);
                }
                if ((local_8980->marker & 0xf8) != 0xd0) goto LAB_00118bbe;
                stbi__jpeg_reset(local_8980);
              }
            }
          }
LAB_00118bbe:
          bVar57 = true;
        }
LAB_00118b34:
        if (!bVar57) goto LAB_00119bcc;
LAB_00118b3c:
        bVar15 = local_8980->marker;
LAB_00118b43:
        if (bVar15 == 0xff) {
          while (iVar16 = stbi__at_eof(local_8980->s), iVar16 == 0) {
            sVar9 = stbi__get8(local_8980->s);
            while (sVar9 == 0xff) {
              iVar16 = stbi__at_eof(local_8980->s);
              if (iVar16 != 0) goto LAB_00118b8b;
              sVar9 = stbi__get8(local_8980->s);
              if ((byte)(sVar9 - 1) < 0xfe) goto LAB_00118b8d;
            }
          }
LAB_00118b8b:
          sVar9 = 0xff;
LAB_00118b8d:
          local_8980->marker = sVar9;
        }
        bVar15 = stbi__get_marker(local_8980);
        if ((bVar15 & 0xf8) == 0xd0) {
LAB_001180e4:
          bVar15 = stbi__get_marker(local_8980);
        }
      }
      uVar18 = (uint)bVar15;
      if (uVar18 == 0xdc) {
        iVar16 = stbi__get16be(local_8980->s);
        sVar17 = stbi__get16be(local_8980->s);
        if (iVar16 == 4) {
          if (sVar17 == local_8980->s->img_y) goto LAB_001180e4;
          pcVar26 = "bad DNL height";
        }
        else {
          pcVar26 = "bad DNL len";
        }
        goto LAB_00119bc3;
      }
      if (uVar18 == 0xd9) {
        if (local_8980->progressive != 0) {
          for (lVar36 = 0; lVar36 < local_8980->s->img_n; lVar36 = lVar36 + 1) {
            uVar18 = local_8980->img_comp[lVar36].x + 7 >> 3;
            iVar16 = local_8980->img_comp[lVar36].y + 7 >> 3;
            uVar51 = 0;
            uVar40 = (ulong)uVar18;
            if ((int)uVar18 < 1) {
              uVar40 = uVar51;
            }
            if (iVar16 < 1) {
              iVar16 = 0;
            }
            while (iVar21 = (int)uVar51, iVar21 != iVar16) {
              for (uVar51 = 0; uVar51 != uVar40; uVar51 = uVar51 + 1) {
                psVar55 = paVar1[lVar36].coeff;
                iVar43 = paVar1[lVar36].coeff_w * iVar21;
                iVar39 = paVar1[lVar36].tq;
                iVar47 = iVar43 + (int)uVar51;
                for (lVar32 = 0; lVar32 != 0x40; lVar32 = lVar32 + 1) {
                  psVar55[iVar47 * 0x40 + lVar32] =
                       psVar55[iVar47 * 0x40 + lVar32] * local_8980->dequant[iVar39][lVar32];
                }
                (*local_8980->idct_block_kernel)
                          (paVar1[lVar36].data + uVar51 * 8 + (long)(iVar21 * 8 * paVar1[lVar36].w2)
                           ,paVar1[lVar36].w2,psVar55 + (iVar43 + (int)uVar51) * 0x40);
              }
              uVar51 = (ulong)(iVar21 + 1);
            }
          }
        }
      }
      else {
        iVar16 = stbi__process_marker(local_8980,uVar18);
        if (iVar16 != 0) goto LAB_001180e4;
      }
      psVar42 = local_8980->s;
      uVar18 = psVar42->img_n;
      uVar23 = (2 < (int)uVar18) + 1 + (uint)(2 < (int)uVar18);
      if (req_comp != 0) {
        uVar23 = req_comp;
      }
      if (uVar18 == 3) {
        bVar57 = true;
        if (local_8980->rgb != 3) {
          if (local_8980->app14_color_transform == 0) {
            bVar57 = local_8980->jfif == 0;
          }
          else {
            bVar57 = false;
          }
        }
      }
      else {
        bVar57 = false;
      }
      uVar25 = 1;
      if (bVar57) {
        uVar25 = uVar18;
      }
      if (2 < (int)uVar23) {
        uVar25 = uVar18;
      }
      if (uVar18 != 3) {
        uVar25 = uVar18;
      }
      if (0 < (int)uVar25) {
        _value = (stbi_uc *)0x0;
        sVar17 = psVar42->img_x;
        for (lVar36 = 0; (ulong)uVar25 * 0x30 != lVar36; lVar36 = lVar36 + 0x30) {
          pvVar27 = malloc((ulong)(sVar17 + 3));
          *(void **)((long)&local_8980->img_comp[0].linebuf + lVar36 * 2) = pvVar27;
          if (pvVar27 == (void *)0x0) goto LAB_0011a70d;
          uVar40 = (long)local_8980->img_h_max /
                   (long)*(int *)((long)&local_8980->img_comp[0].h + lVar36 * 2);
          iVar16 = (int)uVar40;
          *(int *)(pal[6] + lVar36) = iVar16;
          iVar21 = local_8980->img_v_max / *(int *)((long)&local_8980->img_comp[0].v + lVar36 * 2);
          *(int *)(pal[7] + lVar36) = iVar21;
          *(int *)(pal[9] + lVar36) = iVar21 >> 1;
          *(int *)(pal[8] + lVar36) = (int)((ulong)(iVar16 + (sVar17 - 1)) / (uVar40 & 0xffffffff));
          psVar56 = pal[10] + lVar36;
          psVar56[0] = '\0';
          psVar56[1] = '\0';
          psVar56[2] = '\0';
          psVar56[3] = '\0';
          uVar35 = *(undefined8 *)((long)&local_8980->img_comp[0].data + lVar36 * 2);
          *(undefined8 *)(pal[4] + lVar36) = uVar35;
          *(undefined8 *)(pal[2] + lVar36) = uVar35;
          if (iVar16 == 2) {
            pcVar34 = stbi__resample_row_h_2;
            if (iVar21 != 1) {
              if (iVar21 != 2) goto LAB_0011a0b3;
              pcVar34 = local_8980->resample_row_hv_2_kernel;
            }
          }
          else if (iVar16 == 1) {
            pcVar34 = stbi__resample_row_generic;
            if (iVar21 == 2) {
              pcVar34 = stbi__resample_row_v_2;
            }
            if (iVar21 == 1) {
              pcVar34 = resample_row_1;
            }
          }
          else {
LAB_0011a0b3:
            pcVar34 = stbi__resample_row_generic;
          }
          *(code **)(pal[0] + lVar36) = pcVar34;
        }
        sVar19 = psVar42->img_y;
        psVar28 = (stbi__context *)stbi__malloc_mad3(uVar23,sVar17,sVar19,1);
        if (psVar28 == (stbi__context *)0x0) {
LAB_0011a70d:
          stbi__cleanup_jpeg(local_8980);
          *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
          psVar28 = (stbi__context *)0x0;
        }
        else {
          iVar16 = 0;
          for (uVar18 = 0; uVar18 < sVar19; uVar18 = uVar18 + 1) {
            sVar17 = psVar42->img_x;
            psVar56 = value;
            for (lVar36 = 0; (ulong)uVar25 * 0x30 != lVar36; lVar36 = lVar36 + 0x30) {
              iVar21 = *(int *)(pal[9] + lVar36);
              iVar39 = *(int *)(pal[7] + lVar36);
              iVar43 = iVar39 >> 1;
              psVar54 = pal[4] + lVar36;
              if (iVar21 < iVar43) {
                psVar54 = pal[2] + lVar36;
              }
              psVar31 = pal[4] + lVar36;
              if (iVar43 <= iVar21) {
                psVar31 = pal[2] + lVar36;
              }
              uVar35 = (**(code **)(pal[0] + lVar36))
                                 (*(undefined8 *)
                                   ((long)&local_8980->img_comp[0].linebuf + lVar36 * 2),
                                  *(undefined8 *)psVar54,*(undefined8 *)psVar31,
                                  *(undefined4 *)(pal[8] + lVar36));
              *(undefined8 *)psVar56 = uVar35;
              *(int *)(pal[9] + lVar36) = iVar21 + 1;
              if (iVar39 <= iVar21 + 1) {
                psVar54 = pal[9] + lVar36;
                psVar54[0] = '\0';
                psVar54[1] = '\0';
                psVar54[2] = '\0';
                psVar54[3] = '\0';
                lVar32 = *(long *)(pal[4] + lVar36);
                *(long *)(pal[2] + lVar36) = lVar32;
                iVar21 = *(int *)(pal[10] + lVar36) + 1;
                *(int *)(pal[10] + lVar36) = iVar21;
                if (iVar21 < *(int *)((long)&local_8980->img_comp[0].y + lVar36 * 2)) {
                  *(long *)(pal[4] + lVar36) =
                       lVar32 + *(int *)((long)&local_8980->img_comp[0].w2 + lVar36 * 2);
                }
              }
              psVar56 = psVar56 + 8;
            }
            if ((int)uVar23 < 3) {
              psVar42 = local_8980->s;
              if (bVar57) {
                uVar40 = (ulong)(sVar17 * iVar16);
                if (uVar23 == 1) {
                  for (pbVar46 = (byte *)0x0; pbVar46 < (byte *)(ulong)psVar42->img_x;
                      pbVar46 = pbVar46 + 1) {
                    pbVar46[(long)(psVar28->buffer_start + uVar40 + -0x38)] =
                         (byte)((uint)*pbVar46 * 0x1d +
                                (uint)*pbVar46 * 0x96 + (uint)_value[(long)pbVar46] * 0x4d >> 8);
                  }
                }
                else {
                  for (pbVar46 = (byte *)0x0; pbVar46 < (byte *)(ulong)psVar42->img_x;
                      pbVar46 = pbVar46 + 1) {
                    psVar28->buffer_start[(long)pbVar46 * 2 + uVar40 + -0x38] =
                         (stbi_uc)((uint)*pbVar46 * 0x1d +
                                   (uint)*pbVar46 * 0x96 + (uint)_value[(long)pbVar46] * 0x4d >> 8);
                    psVar28->buffer_start[(long)pbVar46 * 2 + uVar40 + 0xffffffffffffffc9] = 0xff;
                  }
                }
              }
              else if (psVar42->img_n == 4) {
                if (local_8980->app14_color_transform == 2) {
                  psVar56 = psVar28->buffer_start + (ulong)(sVar17 * iVar16) + 0xffffffffffffffc9;
                  for (pbVar46 = (byte *)0x0; pbVar46 < (byte *)(ulong)psVar42->img_x;
                      pbVar46 = pbVar46 + 1) {
                    iVar21 = (_value[(long)pbVar46] ^ 0xff) * (uint)*pbVar46;
                    psVar56[-1] = (char)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                    *psVar56 = 0xff;
                    psVar56 = psVar56 + uVar23;
                  }
                }
                else {
                  if (local_8980->app14_color_transform != 0) goto LAB_0011a547;
                  psVar56 = psVar28->buffer_start + (ulong)(sVar17 * iVar16) + 0xffffffffffffffc9;
                  for (pbVar46 = (byte *)0x0; pbVar46 < (byte *)(ulong)psVar42->img_x;
                      pbVar46 = pbVar46 + 1) {
                    bVar15 = *pbVar46;
                    iVar21 = (uint)_value[(long)pbVar46] * (uint)bVar15;
                    iVar39 = (uint)*pbVar46 * (uint)bVar15;
                    psVar56[-1] = (char)((((uint)*pbVar46 * (uint)bVar15 + 0x80 >> 8) +
                                          (uint)*pbVar46 * (uint)bVar15 + 0x80 >> 8) * 0x1d +
                                         (iVar39 + (iVar39 + 0x80U >> 8) + 0x80 >> 8) * 0x96 +
                                         (iVar21 + (iVar21 + 0x80U >> 8) + 0x80 >> 8) * 0x4d >> 8);
                    *psVar56 = 0xff;
                    psVar56 = psVar56 + uVar23;
                  }
                }
              }
              else {
LAB_0011a547:
                uVar40 = (ulong)(sVar17 * iVar16);
                if (uVar23 == 1) {
                  for (uVar51 = 0; uVar51 < psVar42->img_x; uVar51 = uVar51 + 1) {
                    psVar28->buffer_start[uVar51 + uVar40 + -0x38] = _value[uVar51];
                  }
                }
                else {
                  for (uVar51 = 0; uVar51 < psVar42->img_x; uVar51 = uVar51 + 1) {
                    psVar28->buffer_start[uVar51 * 2 + uVar40 + -0x38] = _value[uVar51];
                    psVar28->buffer_start[uVar51 * 2 + uVar40 + 0xffffffffffffffc9] = 0xff;
                  }
                }
              }
            }
            else {
              psVar42 = local_8980->s;
              if (psVar42->img_n == 3) {
                if (bVar57) {
                  psVar56 = psVar28->buffer_start + (ulong)(sVar17 * iVar16) + 0xffffffffffffffcb;
                  for (puVar44 = (undefined1 *)0x0; puVar44 < (undefined1 *)(ulong)psVar42->img_x;
                      puVar44 = puVar44 + 1) {
                    psVar56[-3] = _value[(long)puVar44];
                    psVar56[-2] = *puVar44;
                    psVar56[-1] = *puVar44;
                    *psVar56 = 0xff;
                    psVar56 = psVar56 + uVar23;
                  }
                }
                else {
LAB_0011a57d:
                  (*local_8980->YCbCr_to_RGB_kernel)
                            (psVar28->buffer_start + (ulong)(uVar18 * uVar23 * sVar17) + -0x38,
                             _value,(stbi_uc *)0x0,(stbi_uc *)0x0,psVar42->img_x,uVar23);
                }
              }
              else if (psVar42->img_n == 4) {
                if (local_8980->app14_color_transform == 2) {
                  (*local_8980->YCbCr_to_RGB_kernel)
                            (psVar28->buffer_start + (ulong)(uVar18 * uVar23 * sVar17) + -0x38,
                             _value,(stbi_uc *)0x0,(stbi_uc *)0x0,psVar42->img_x,uVar23);
                  psVar42 = local_8980->s;
                  psVar56 = psVar28->buffer_start + (ulong)(sVar17 * iVar16) + 0xffffffffffffffca;
                  for (pbVar46 = (byte *)0x0; pbVar46 < (byte *)(ulong)psVar42->img_x;
                      pbVar46 = pbVar46 + 1) {
                    bVar15 = *pbVar46;
                    iVar21 = (psVar56[-2] ^ 0xff) * (uint)bVar15;
                    psVar56[-2] = (byte)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                    iVar21 = (psVar56[-1] ^ 0xff) * (uint)bVar15;
                    psVar56[-1] = (byte)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                    iVar21 = (*psVar56 ^ 0xff) * (uint)bVar15;
                    *psVar56 = (byte)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                    psVar56 = psVar56 + uVar23;
                  }
                }
                else {
                  if (local_8980->app14_color_transform != 0) goto LAB_0011a57d;
                  psVar56 = psVar28->buffer_start + (ulong)(sVar17 * iVar16) + 0xffffffffffffffcb;
                  for (pbVar46 = (byte *)0x0; pbVar46 < (byte *)(ulong)psVar42->img_x;
                      pbVar46 = pbVar46 + 1) {
                    bVar15 = *pbVar46;
                    iVar21 = (uint)_value[(long)pbVar46] * (uint)bVar15;
                    psVar56[-3] = (char)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                    iVar21 = (uint)*pbVar46 * (uint)bVar15;
                    psVar56[-2] = (char)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                    psVar56[-1] = (char)(((uint)*pbVar46 * (uint)bVar15 + 0x80 >> 8) +
                                         (uint)*pbVar46 * (uint)bVar15 + 0x80 >> 8);
                    *psVar56 = 0xff;
                    psVar56 = psVar56 + uVar23;
                  }
                }
              }
              else {
                psVar56 = psVar28->buffer_start + (ulong)(sVar17 * iVar16) + 0xffffffffffffffcb;
                for (uVar40 = 0; uVar40 < psVar42->img_x; uVar40 = uVar40 + 1) {
                  sVar9 = _value[uVar40];
                  psVar56[-1] = sVar9;
                  psVar56[-2] = sVar9;
                  psVar56[-3] = sVar9;
                  *psVar56 = 0xff;
                  psVar56 = psVar56 + uVar23;
                }
              }
            }
            psVar42 = local_8980->s;
            sVar19 = psVar42->img_y;
            iVar16 = iVar16 + uVar23;
          }
          stbi__cleanup_jpeg(local_8980);
          psVar42 = local_8980->s;
          *x = psVar42->img_x;
          *y = psVar42->img_y;
          if (comp != (int *)0x0) {
            *comp = (uint)(2 < psVar42->img_n) * 2 + 1;
          }
        }
        goto LAB_001176a6;
      }
    }
    goto LAB_00119bcc;
  }
  *(char **)(in_FS_OFFSET + -0x20) = "bad req_comp";
  goto LAB_00119bd9;
code_r0x00117b93:
  uVar25 = 4 - ((uVar48 & 0x10) == 0);
  if (comp != (int *)0x0) {
    *comp = uVar25;
  }
  for (uVar40 = 0; uVar40 != uVar23; uVar40 = uVar40 + 1) {
    psVar56 = local_8980->huff_dc[0].fast + (long)(int)(uVar18 * 4 * (int)uVar40) + -8;
    for (lVar32 = 0; lVar36 != lVar32; lVar32 = lVar32 + 1) {
      lVar6 = lVar32 * 3;
      sVar9 = pal[0][lVar6 + 1];
      psVar54 = psVar56;
      uVar48 = uVar18;
      if (sVar9 == '\0') {
        while (bVar57 = uVar48 != 0, uVar48 = uVar48 - 1, bVar57) {
          psVar31 = stbi__readval(s,(uint)pal[0][lVar6 + 2],psVar54);
          if (psVar31 == (stbi_uc *)0x0) goto LAB_001194c2;
          psVar54 = psVar54 + 4;
        }
      }
      else if (sVar9 == '\x01') {
        for (; 0 < (int)uVar48; uVar48 = uVar48 - (uVar52 & 0xff)) {
          bVar15 = stbi__get8(s);
          iVar16 = stbi__at_eof(s);
          if (iVar16 != 0) goto LAB_001194a9;
          psVar31 = stbi__readval(s,(uint)pal[0][lVar6 + 2],value);
          if (psVar31 == (stbi_uc *)0x0) goto LAB_001194c2;
          uVar52 = (uint)bVar15;
          if (uVar48 < bVar15) {
            uVar52 = uVar48;
          }
          uVar49 = uVar52 & 0xff;
          while (bVar57 = uVar49 != 0, uVar49 = uVar49 - 1, bVar57) {
            stbi__copyval((uint)pal[0][lVar6 + 2],psVar54,value);
            psVar54 = psVar54 + 4;
          }
        }
      }
      else {
        if (sVar9 != '\x02') {
          pcVar26 = "bad format";
LAB_0011a735:
          *(char **)(in_FS_OFFSET + -0x20) = pcVar26;
          goto LAB_001194c2;
        }
        for (; 0 < (int)uVar48; uVar48 = uVar48 - iVar16) {
          bVar15 = stbi__get8(s);
          iVar16 = stbi__at_eof(s);
          if (iVar16 != 0) goto LAB_001194a9;
          uVar52 = (uint)bVar15;
          if ((char)bVar15 < '\0') {
            if (uVar52 == 0x80) {
              iVar16 = stbi__get16be(s);
            }
            else {
              iVar16 = uVar52 - 0x7f;
            }
            if ((int)uVar48 < iVar16) goto LAB_00119d9b;
            psVar31 = stbi__readval(s,(uint)pal[0][lVar6 + 2],value);
            iVar21 = iVar16;
            if (psVar31 == (stbi_uc *)0x0) goto LAB_001194c2;
            while (iVar21 != 0) {
              stbi__copyval((uint)pal[0][lVar6 + 2],psVar54,value);
              psVar54 = psVar54 + 4;
              iVar21 = iVar21 + -1;
            }
          }
          else {
            iVar16 = bVar15 + 1;
            iVar21 = iVar16;
            if (uVar48 <= uVar52) {
LAB_00119d9b:
              pcVar26 = "bad file";
              goto LAB_0011a735;
            }
            while (bVar57 = iVar21 != 0, iVar21 = iVar21 + -1, bVar57) {
              psVar31 = stbi__readval(s,(uint)pal[0][lVar6 + 2],psVar54);
              if (psVar31 == (stbi_uc *)0x0) goto LAB_001194c2;
              psVar54 = psVar54 + 4;
            }
          }
        }
      }
    }
  }
LAB_001194eb:
  *x = uVar18;
  *y = uVar23;
  bVar57 = req_comp != 0;
  if (bVar57) {
    uVar25 = req_comp;
  }
  req_comp = uVar25;
  if (!bVar57 && comp != (int *)0x0) {
    req_comp = *comp;
  }
  uVar25 = 4;
  goto LAB_00119515;
LAB_001194a9:
  *(char **)(in_FS_OFFSET + -0x20) = "bad file";
  goto LAB_001194c2;
LAB_00119a37:
  pcVar26 = "bad huffman code";
  goto LAB_00119bc3;
LAB_00119bb3:
  pcVar26 = "bad huffman code";
LAB_00119bc3:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar26;
LAB_00119bcc:
  stbi__cleanup_jpeg(local_8980);
LAB_00119bd9:
  psVar28 = (stbi__context *)0x0;
LAB_001176a6:
  free(local_8980);
  return psVar28;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}